

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystem.cpp
# Opt level: O1

void __thiscall chrono::ChSystem::Add(ChSystem *this,shared_ptr<chrono::ChPhysicsItem> *item)

{
  element_type *peVar1;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  element_type *local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  long local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  long local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  long local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  long local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  peVar1 = (item->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    lVar2 = 0;
  }
  else {
    lVar2 = __dynamic_cast(peVar1,&ChPhysicsItem::typeinfo,&ChBody::typeinfo,0);
  }
  if (lVar2 == 0) {
    lVar2 = 0;
    p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    p_Var3 = (item->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
  }
  if (lVar2 != 0) {
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
    local_30 = lVar2;
    local_28 = p_Var3;
    (*(this->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x25])(this,&local_30)
    ;
    if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
    }
  }
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  if (lVar2 == 0) {
    peVar1 = (item->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (peVar1 == (element_type *)0x0) {
      lVar2 = 0;
    }
    else {
      lVar2 = __dynamic_cast(peVar1,&ChPhysicsItem::typeinfo,&ChShaft::typeinfo,0);
    }
    if (lVar2 == 0) {
      lVar2 = 0;
      p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      p_Var3 = (item->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        }
      }
    }
    if (lVar2 != 0) {
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        }
      }
      local_40 = lVar2;
      local_38 = p_Var3;
      (*(this->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x26])
                (this,&local_40);
      if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
      }
    }
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    if (lVar2 == 0) {
      peVar1 = (item->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (peVar1 == (element_type *)0x0) {
        lVar2 = 0;
      }
      else {
        lVar2 = __dynamic_cast(peVar1,&ChPhysicsItem::typeinfo,&ChLinkBase::typeinfo,0);
      }
      if (lVar2 == 0) {
        lVar2 = 0;
        p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        p_Var3 = (item->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          }
        }
      }
      if (lVar2 != 0) {
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          }
        }
        local_50 = lVar2;
        local_48 = p_Var3;
        (*(this->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x27])
                  (this,&local_50);
        if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
        }
      }
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
      if (lVar2 == 0) {
        peVar1 = (item->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        if (peVar1 == (element_type *)0x0) {
          lVar2 = 0;
        }
        else {
          lVar2 = __dynamic_cast(peVar1,&ChPhysicsItem::typeinfo,&fea::ChMesh::typeinfo,0);
        }
        if (lVar2 == 0) {
          lVar2 = 0;
          p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
        else {
          p_Var3 = (item->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi;
          if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
            }
          }
        }
        if (lVar2 != 0) {
          if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
            }
          }
          local_60 = lVar2;
          local_58 = p_Var3;
          (*(this->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x28])
                    (this,&local_60);
          if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
          }
        }
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
        }
        if (lVar2 == 0) {
          local_70 = (item->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr;
          local_68 = (item->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>).
                     _M_refcount._M_pi;
          if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              local_68->_M_use_count = local_68->_M_use_count + 1;
              UNLOCK();
            }
            else {
              local_68->_M_use_count = local_68->_M_use_count + 1;
            }
          }
          (*(this->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x29])
                    (this,&local_70);
          if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void ChSystem::Add(std::shared_ptr<ChPhysicsItem> item) {
    if (auto body = std::dynamic_pointer_cast<ChBody>(item)) {
        AddBody(body);
        return;
    }

    if (auto shaft = std::dynamic_pointer_cast<ChShaft>(item)) {
        AddShaft(shaft);
        return;
    }

    if (auto link = std::dynamic_pointer_cast<ChLinkBase>(item)) {
        AddLink(link);
        return;
    }

    if (auto mesh = std::dynamic_pointer_cast<fea::ChMesh>(item)) {
        AddMesh(mesh);
        return;
    }

    AddOtherPhysicsItem(item);
}